

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O2

_Bool node_verify(wb_tree *tree,wb_node *parent,wb_node *node,uint *weight)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  uint32_t uVar6;
  char *pcVar7;
  uint rweight;
  uint lweight;
  
  if (parent == (wb_node *)0x0) {
    if (tree->root != node) {
      pcVar7 = "tree->root == node";
      uVar5 = 0x17d;
      goto LAB_001063ca;
    }
  }
  else if ((parent->llink != node) && (parent->rlink != node)) {
    pcVar7 = "parent->llink == node || parent->rlink == node";
    uVar5 = 0x17f;
    goto LAB_001063ca;
  }
  if (node == (wb_node *)0x0) {
    *weight = 1;
    return true;
  }
  if (node->parent != parent) {
    pcVar7 = "node->parent == parent";
    uVar5 = 0x182;
    goto LAB_001063ca;
  }
  if (parent != (wb_node *)0x0) {
    if (parent->llink == node) {
      iVar3 = (*tree->cmp_func)(parent->key,node->key);
      if (iVar3 < 1) {
        pcVar7 = "tree->cmp_func(parent->key, node->key) > 0";
        uVar5 = 0x185;
        goto LAB_001063ca;
      }
    }
    else {
      if (parent->rlink != node) {
        fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                ,0x187,"node_verify","parent->rlink == node");
        abort();
      }
      iVar3 = (*tree->cmp_func)(parent->key,node->key);
      if (-1 < iVar3) {
        pcVar7 = "tree->cmp_func(parent->key, node->key) < 0";
        uVar5 = 0x188;
LAB_001063ca:
        fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                ,uVar5,"node_verify",pcVar7);
        return false;
      }
    }
  }
  _Var2 = node_verify(tree,node,node->llink,&lweight);
  if ((_Var2) && (_Var2 = node_verify(tree,node,node->rlink,&rweight), _Var2)) {
    if (node->llink == (wb_node *)0x0) {
      uVar4 = 1;
    }
    else {
      uVar4 = node->llink->weight;
    }
    if (uVar4 == lweight) {
      if (node->rlink == (wb_node *)0x0) {
        uVar6 = 1;
      }
      else {
        uVar6 = node->rlink->weight;
      }
      if (uVar6 == rweight) {
        uVar1 = node->weight;
        if (uVar1 == uVar6 + uVar4) {
          if (uVar4 * 1000 < uVar1 * 0x124) {
            pcVar7 = "lweight * 1000U >= node->weight * 292U";
            uVar5 = 0x192;
          }
          else {
            if (uVar4 * 1000 <= uVar1 * 0x2c4) {
              *weight = uVar1;
              return true;
            }
            pcVar7 = "lweight * 1000U <= node->weight * 708U";
            uVar5 = 0x193;
          }
        }
        else {
          pcVar7 = "node->weight == lweight + rweight";
          uVar5 = 0x191;
        }
      }
      else {
        pcVar7 = "WEIGHT(node->rlink) == rweight";
        uVar5 = 400;
      }
    }
    else {
      pcVar7 = "WEIGHT(node->llink) == lweight";
      uVar5 = 399;
    }
    fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
            ,uVar5,"node_verify",pcVar7);
  }
  return false;
}

Assistant:

static bool
node_verify(const wb_tree* tree, const wb_node* parent, const wb_node* node,
	    unsigned *weight)
{
    if (!parent) {
	VERIFY(tree->root == node);
    } else {
	VERIFY(parent->llink == node || parent->rlink == node);
    }
    if (node) {
	VERIFY(node->parent == parent);
	if (parent) {
	    if (parent->llink == node) {
		VERIFY(tree->cmp_func(parent->key, node->key) > 0);
	    } else {
		ASSERT(parent->rlink == node);
		VERIFY(tree->cmp_func(parent->key, node->key) < 0);
	    }
	}
	unsigned lweight, rweight;
	if (!node_verify(tree, node, node->llink, &lweight) ||
	    !node_verify(tree, node, node->rlink, &rweight))
	    return false;
	VERIFY(WEIGHT(node->llink) == lweight);
	VERIFY(WEIGHT(node->rlink) == rweight);
	VERIFY(node->weight == lweight + rweight);
	VERIFY(lweight * 1000U >= node->weight * 292U);
	VERIFY(lweight * 1000U <= node->weight * 708U);
	*weight = lweight + rweight;
    } else {
	*weight = 1;
    }
    return true;
}